

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebugIfHasDebugStreamContainer<QList<QByteArray>,_QByteArray>
operator<<(QDebug debug,QList<QByteArray> *vec)

{
  QList<QByteArray> *in_RDX;
  long in_FS_OFFSET;
  QDebug local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.stream = (Stream *)(vec->d).d;
  (vec->d).d = (Data *)0x0;
  QtPrivate::printSequentialContainer<QList<QByteArray>>
            ((QtPrivate *)debug.stream,(Stream *)&local_18,"QList",in_RDX);
  QDebug::~QDebug(&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (QDebugIfHasDebugStreamContainer<QList<QByteArray>,_QByteArray>)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebugIfHasDebugStreamContainer<QList<T>, T> operator<<(QDebug debug, const QList<T> &vec)
{
    return QtPrivate::printSequentialContainer(std::move(debug), "QList", vec);
}